

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_cond.cpp
# Opt level: O2

void __thiscall SharedCond::SharedCond(SharedCond *this)

{
  _Alloc_hider __p;
  int iVar1;
  __pid_t _Var2;
  ContextManager *pCVar3;
  pthread_condattr_t condattr;
  string local_30;
  
  (this->cond_)._M_t.
  super___uniq_ptr_impl<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_SharedMemoryObject<pthread_cond_t>_*,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
  .super__Head_base<0UL,_SharedMemoryObject<pthread_cond_t>_*,_false>._M_head_impl =
       (SharedMemoryObject<pthread_cond_t> *)0x0;
  std::make_unique<SharedMemoryObject<pthread_cond_t>>();
  __p._M_p = local_30._M_dataplus._M_p;
  local_30._M_dataplus._M_p = (pointer)0x0;
  std::
  __uniq_ptr_impl<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
  ::reset((__uniq_ptr_impl<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
           *)this,(pointer)__p._M_p);
  std::
  unique_ptr<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
  ::~unique_ptr((unique_ptr<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
                 *)&local_30);
  iVar1 = pthread_condattr_init((pthread_condattr_t *)&condattr);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Failed to initialize condattr: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  iVar1 = pthread_condattr_setpshared((pthread_condattr_t *)&condattr,1);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Failed to set PTHREAD_PROCESS_SHARED to condattr: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  iVar1 = pthread_cond_init((pthread_cond_t *)
                            ((this->cond_)._M_t.
                             super___uniq_ptr_impl<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_SharedMemoryObject<pthread_cond_t>_*,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
                             .super__Head_base<0UL,_SharedMemoryObject<pthread_cond_t>_*,_false>.
                            _M_head_impl)->ptr_,(pthread_condattr_t *)&condattr);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Failed to initialize cond: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  iVar1 = pthread_condattr_destroy((pthread_condattr_t *)&condattr);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Failed to destroy condattr: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  _Var2 = getpid();
  this->owner_pid_ = _Var2;
  return;
}

Assistant:

SharedCond::SharedCond() {
    cond_ = std::make_unique<SharedMemoryObject<pthread_cond_t>>();
    pthread_condattr_t condattr;
    if (pthread_condattr_init(&condattr) != 0) {
        die(format("Failed to initialize condattr: %m"));
    }
    if (pthread_condattr_setpshared(&condattr, PTHREAD_PROCESS_SHARED) != 0) {
        die(format("Failed to set PTHREAD_PROCESS_SHARED to condattr: %m"));
    }
    if (pthread_cond_init(cond_->get(), &condattr)) {
        die(format("Failed to initialize cond: %m"));
    }
    if (pthread_condattr_destroy(&condattr) != 0) {
        die(format("Failed to destroy condattr: %m"));
    }
    owner_pid_ = getpid();
}